

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O3

void __thiscall MyGame::Example::MonsterT::MonsterT(MonsterT *this,MonsterT *o)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  Any AVar2;
  AnyUniqueAliases AVar3;
  AnyAmbiguousAliases AVar4;
  _Head_base<0UL,_MyGame::Example::Vec3_*,_false> _Var5;
  pointer pcVar6;
  StatT *pSVar7;
  long lVar8;
  pointer puVar9;
  pointer puVar10;
  pointer puVar11;
  double dVar12;
  uint64_t uVar13;
  LongEnum LVar14;
  float fVar15;
  float fVar16;
  int32_t iVar17;
  uint8_t uVar18;
  int8_t iVar19;
  Test TVar20;
  int16_t iVar21;
  uint32_t uVar22;
  float fVar23;
  _Head_base<0UL,_MyGame::Example::Vec3_*,_false> _Var24;
  MonsterT *pMVar25;
  MonsterT *this_01;
  StatT *pSVar26;
  InParentNamespaceT *pIVar27;
  unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
  *vector_of_referrables_;
  pointer puVar28;
  pointer puVar29;
  pointer puVar30;
  pointer *__ptr;
  MonsterT *local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_d8;
  vector<MyGame::Example::Color,_std::allocator<MyGame::Example::Color>_> *local_d0;
  vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
  *local_c8;
  vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
  *local_c0;
  vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
  *local_b8;
  vector<std::unique_ptr<MyGame::Example::MonsterT,std::default_delete<MyGame::Example::MonsterT>>,std::allocator<std::unique_ptr<MyGame::Example::MonsterT,std::default_delete<MyGame::Example::MonsterT>>>>
  *local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a0;
  vector<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_> *local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  string *local_80;
  vector<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_> *local_78;
  vector<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_> *local_70;
  vector<double,_std::allocator<double>_> *local_68;
  vector<long,_std::allocator<long>_> *local_60;
  vector<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_> *local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_50;
  vector<MyGame::Example::Ability,_std::allocator<MyGame::Example::Ability>_> *local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  vector<bool,_std::allocator<bool>_> *local_38;
  
  _Var5._M_head_impl =
       (o->pos)._M_t.
       super___uniq_ptr_impl<MyGame::Example::Vec3,_std::default_delete<MyGame::Example::Vec3>_>.
       _M_t.
       super__Tuple_impl<0UL,_MyGame::Example::Vec3_*,_std::default_delete<MyGame::Example::Vec3>_>.
       super__Head_base<0UL,_MyGame::Example::Vec3_*,_false>._M_head_impl;
  if (_Var5._M_head_impl == (Vec3 *)0x0) {
    _Var24._M_head_impl = (Vec3 *)0x0;
  }
  else {
    _Var24._M_head_impl = (Vec3 *)operator_new(0x20);
    fVar15 = (_Var5._M_head_impl)->y_;
    fVar16 = (_Var5._M_head_impl)->z_;
    iVar17 = (_Var5._M_head_impl)->padding0__;
    dVar12 = (_Var5._M_head_impl)->test1_;
    uVar18 = (_Var5._M_head_impl)->test2_;
    iVar19 = (_Var5._M_head_impl)->padding1__;
    TVar20 = (_Var5._M_head_impl)->test3_;
    iVar21 = (_Var5._M_head_impl)->padding2__;
    (_Var24._M_head_impl)->x_ = (_Var5._M_head_impl)->x_;
    (_Var24._M_head_impl)->y_ = fVar15;
    (_Var24._M_head_impl)->z_ = fVar16;
    (_Var24._M_head_impl)->padding0__ = iVar17;
    (_Var24._M_head_impl)->test1_ = dVar12;
    (_Var24._M_head_impl)->test2_ = uVar18;
    (_Var24._M_head_impl)->padding1__ = iVar19;
    (_Var24._M_head_impl)->test3_ = TVar20;
    (_Var24._M_head_impl)->padding2__ = iVar21;
  }
  (this->pos)._M_t.
  super___uniq_ptr_impl<MyGame::Example::Vec3,_std::default_delete<MyGame::Example::Vec3>_>._M_t.
  super__Tuple_impl<0UL,_MyGame::Example::Vec3_*,_std::default_delete<MyGame::Example::Vec3>_>.
  super__Head_base<0UL,_MyGame::Example::Vec3_*,_false>._M_head_impl = _Var24._M_head_impl;
  iVar21 = o->hp;
  this->mana = o->mana;
  this->hp = iVar21;
  local_80 = &this->name;
  paVar1 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar6 = (o->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar6,pcVar6 + (o->name)._M_string_length);
  local_90 = &this->inventory;
  local_88 = paVar1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_90,&o->inventory);
  this->color = o->color;
  AVar2 = (o->test).type;
  (this->test).type = AVar2;
  (this->test).value = (void *)0x0;
  if (AVar2 == Any_MAX) {
    pMVar25 = (MonsterT *)operator_new(1);
LAB_0017213c:
    (this->test).value = pMVar25;
  }
  else {
    if (AVar2 == Any_TestSimpleTableWithEnum) {
      pMVar25 = (MonsterT *)operator_new(1);
      *(undefined1 *)
       &(pMVar25->pos)._M_t.
        super___uniq_ptr_impl<MyGame::Example::Vec3,_std::default_delete<MyGame::Example::Vec3>_>.
        _M_t.
        super__Tuple_impl<0UL,_MyGame::Example::Vec3_*,_std::default_delete<MyGame::Example::Vec3>_>
        .super__Head_base<0UL,_MyGame::Example::Vec3_*,_false>._M_head_impl = *(o->test).value;
      goto LAB_0017213c;
    }
    if (AVar2 == Any_Monster) {
      pMVar25 = (MonsterT *)operator_new(800);
      MonsterT(pMVar25,(MonsterT *)(o->test).value);
      goto LAB_0017213c;
    }
  }
  local_98 = &this->test4;
  std::vector<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_>::vector
            (local_98,&o->test4);
  local_a0 = &this->testarrayofstring;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_a0,&o->testarrayofstring);
  local_b0 = (vector<std::unique_ptr<MyGame::Example::MonsterT,std::default_delete<MyGame::Example::MonsterT>>,std::allocator<std::unique_ptr<MyGame::Example::MonsterT,std::default_delete<MyGame::Example::MonsterT>>>>
              *)&this->testarrayoftables;
  (this->testarrayoftables).
  super__Vector_base<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->testarrayoftables).
  super__Vector_base<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->testarrayoftables).
  super__Vector_base<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar25 = (o->enemy)._M_t.
            super___uniq_ptr_impl<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>
            ._M_t.
            super__Tuple_impl<0UL,_MyGame::Example::MonsterT_*,_std::default_delete<MyGame::Example::MonsterT>_>
            .super__Head_base<0UL,_MyGame::Example::MonsterT_*,_false>._M_head_impl;
  if (pMVar25 == (MonsterT *)0x0) {
    this_01 = (MonsterT *)0x0;
  }
  else {
    this_01 = (MonsterT *)operator_new(800);
    MonsterT(this_01,pMVar25);
  }
  (this->enemy)._M_t.
  super___uniq_ptr_impl<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>.
  _M_t.
  super__Tuple_impl<0UL,_MyGame::Example::MonsterT_*,_std::default_delete<MyGame::Example::MonsterT>_>
  .super__Head_base<0UL,_MyGame::Example::MonsterT_*,_false>._M_head_impl = this_01;
  this_00 = &this->testnestedflatbuffer;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (this_00,&o->testnestedflatbuffer);
  pSVar7 = (o->testempty)._M_t.
           super___uniq_ptr_impl<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>
           ._M_t.
           super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>
           .super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl;
  local_a8 = this_00;
  if (pSVar7 == (StatT *)0x0) {
    pSVar26 = (StatT *)0x0;
  }
  else {
    pSVar26 = (StatT *)operator_new(0x30);
    (pSVar26->id)._M_dataplus._M_p = (pointer)&(pSVar26->id).field_2;
    lVar8 = *(long *)&(pSVar7->id)._M_dataplus;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pSVar26,lVar8,(pSVar7->id)._M_string_length + lVar8);
    pSVar26->count = pSVar7->count;
    pSVar26->val = pSVar7->val;
  }
  (this->testempty)._M_t.
  super___uniq_ptr_impl<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>._M_t.
  super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>.
  super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl = pSVar26;
  this->testbool = o->testbool;
  uVar22 = o->testhashu32_fnv1;
  this->testhashs32_fnv1 = o->testhashs32_fnv1;
  this->testhashu32_fnv1 = uVar22;
  uVar13 = o->testhashu64_fnv1;
  this->testhashs64_fnv1 = o->testhashs64_fnv1;
  this->testhashu64_fnv1 = uVar13;
  this->testhashs32_fnv1a = o->testhashs32_fnv1a;
  this->testhashu32_fnv1a = o->testhashu32_fnv1a;
  uVar13 = o->testhashu64_fnv1a;
  this->testhashs64_fnv1a = o->testhashs64_fnv1a;
  this->testhashu64_fnv1a = uVar13;
  local_38 = &this->testarrayofbools;
  std::vector<bool,_std::allocator<bool>_>::vector(local_38,&o->testarrayofbools);
  fVar15 = o->testf2;
  this->testf = o->testf;
  this->testf2 = fVar15;
  this->testf3 = o->testf3;
  local_40 = &this->testarrayofstring2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_40,&o->testarrayofstring2);
  local_48 = &this->testarrayofsortedstruct;
  std::vector<MyGame::Example::Ability,_std::allocator<MyGame::Example::Ability>_>::vector
            (local_48,&o->testarrayofsortedstruct);
  local_50 = &this->flex;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_50,&o->flex);
  local_58 = &this->test5;
  std::vector<MyGame::Example::Test,_std::allocator<MyGame::Example::Test>_>::vector
            (local_58,&o->test5);
  local_60 = &this->vector_of_longs;
  std::vector<long,_std::allocator<long>_>::vector(local_60,&o->vector_of_longs);
  local_68 = &this->vector_of_doubles;
  std::vector<double,_std::allocator<double>_>::vector(local_68,&o->vector_of_doubles);
  if ((o->parent_namespace_test)._M_t.
      super___uniq_ptr_impl<MyGame::InParentNamespaceT,_std::default_delete<MyGame::InParentNamespaceT>_>
      ._M_t.
      super__Tuple_impl<0UL,_MyGame::InParentNamespaceT_*,_std::default_delete<MyGame::InParentNamespaceT>_>
      .super__Head_base<0UL,_MyGame::InParentNamespaceT_*,_false>._M_head_impl ==
      (InParentNamespaceT *)0x0) {
    pIVar27 = (InParentNamespaceT *)0x0;
  }
  else {
    pIVar27 = (InParentNamespaceT *)operator_new(1);
  }
  (this->parent_namespace_test)._M_t.
  super___uniq_ptr_impl<MyGame::InParentNamespaceT,_std::default_delete<MyGame::InParentNamespaceT>_>
  ._M_t.
  super__Tuple_impl<0UL,_MyGame::InParentNamespaceT_*,_std::default_delete<MyGame::InParentNamespaceT>_>
  .super__Head_base<0UL,_MyGame::InParentNamespaceT_*,_false>._M_head_impl = pIVar27;
  local_b8 = (vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
              *)&this->vector_of_referrables;
  (this->vector_of_referrables).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vector_of_referrables).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vector_of_referrables).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->single_weak_reference = o->single_weak_reference;
  local_70 = &this->vector_of_weak_references;
  std::vector<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_>::
  vector(local_70,&o->vector_of_weak_references);
  local_c0 = (vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
              *)&this->vector_of_strong_referrables;
  (this->vector_of_strong_referrables).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vector_of_strong_referrables).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vector_of_strong_referrables).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->co_owning_reference = o->co_owning_reference;
  local_c8 = (vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
              *)&this->vector_of_co_owning_references;
  (this->vector_of_co_owning_references).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vector_of_co_owning_references).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vector_of_co_owning_references).
  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->non_owning_reference = o->non_owning_reference;
  local_78 = &this->vector_of_non_owning_references;
  std::vector<MyGame::Example::ReferrableT_*,_std::allocator<MyGame::Example::ReferrableT_*>_>::
  vector(local_78,&o->vector_of_non_owning_references);
  AVar3 = (o->any_unique).type;
  (this->any_unique).type = AVar3;
  (this->any_unique).value = (void *)0x0;
  if (AVar3 == AnyUniqueAliases_M2) {
    pMVar25 = (MonsterT *)operator_new(1);
LAB_00172483:
    (this->any_unique).value = pMVar25;
  }
  else {
    if (AVar3 == AnyUniqueAliases_TS) {
      pMVar25 = (MonsterT *)operator_new(1);
      *(undefined1 *)
       &(pMVar25->pos)._M_t.
        super___uniq_ptr_impl<MyGame::Example::Vec3,_std::default_delete<MyGame::Example::Vec3>_>.
        _M_t.
        super__Tuple_impl<0UL,_MyGame::Example::Vec3_*,_std::default_delete<MyGame::Example::Vec3>_>
        .super__Head_base<0UL,_MyGame::Example::Vec3_*,_false>._M_head_impl = *(o->any_unique).value
      ;
      goto LAB_00172483;
    }
    if (AVar3 == AnyUniqueAliases_M) {
      pMVar25 = (MonsterT *)operator_new(800);
      MonsterT(pMVar25,(MonsterT *)(o->any_unique).value);
      goto LAB_00172483;
    }
  }
  AVar4 = (o->any_ambiguous).type;
  (this->any_ambiguous).type = AVar4;
  (this->any_ambiguous).value = (void *)0x0;
  if (AVar4 == AnyAmbiguousAliases_M3) {
    pMVar25 = (MonsterT *)operator_new(800);
    MonsterT(pMVar25,(MonsterT *)(o->any_ambiguous).value);
  }
  else if (AVar4 == AnyAmbiguousAliases_M2) {
    pMVar25 = (MonsterT *)operator_new(800);
    MonsterT(pMVar25,(MonsterT *)(o->any_ambiguous).value);
  }
  else {
    if (AVar4 != AnyAmbiguousAliases_M1) goto LAB_00172511;
    pMVar25 = (MonsterT *)operator_new(800);
    MonsterT(pMVar25,(MonsterT *)(o->any_ambiguous).value);
  }
  (this->any_ambiguous).value = pMVar25;
LAB_00172511:
  std::vector<MyGame::Example::Color,_std::allocator<MyGame::Example::Color>_>::vector
            (&this->vector_of_enums,&o->vector_of_enums);
  this->signed_enum = o->signed_enum;
  local_d8 = &this->testrequirednestedflatbuffer;
  local_d0 = &this->vector_of_enums;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (local_d8,&o->testrequirednestedflatbuffer);
  (this->scalar_key_sorted_tables).
  super__Vector_base<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scalar_key_sorted_tables).
  super__Vector_base<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scalar_key_sorted_tables).
  super__Vector_base<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->native_inline = o->native_inline;
  LVar14 = o->long_enum_normal_default;
  this->long_enum_non_enum_default = o->long_enum_non_enum_default;
  this->long_enum_normal_default = LVar14;
  fVar15 = o->inf_default;
  fVar16 = o->positive_inf_default;
  fVar23 = o->infinity_default;
  this->nan_default = o->nan_default;
  this->inf_default = fVar15;
  this->positive_inf_default = fVar16;
  this->infinity_default = fVar23;
  fVar15 = o->negative_inf_default;
  this->positive_infinity_default = o->positive_infinity_default;
  this->negative_inf_default = fVar15;
  this->negative_infinity_default = o->negative_infinity_default;
  this->double_inf_default = o->double_inf_default;
  std::
  vector<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
  ::reserve((vector<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
             *)local_b0,
            (long)(o->testarrayoftables).
                  super__Vector_base<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(o->testarrayoftables).
                  super__Vector_base<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar29 = (o->testarrayoftables).
            super__Vector_base<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar9 = (o->testarrayoftables).
           super__Vector_base<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>,_std::allocator<std::unique_ptr<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar29 != puVar9) {
    do {
      if ((puVar29->_M_t).
          super___uniq_ptr_impl<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>
          ._M_t.
          super__Tuple_impl<0UL,_MyGame::Example::MonsterT_*,_std::default_delete<MyGame::Example::MonsterT>_>
          .super__Head_base<0UL,_MyGame::Example::MonsterT_*,_false>._M_head_impl == (MonsterT *)0x0
         ) {
        pMVar25 = (MonsterT *)0x0;
      }
      else {
        pMVar25 = (MonsterT *)operator_new(800);
        MonsterT(pMVar25,(puVar29->_M_t).
                         super___uniq_ptr_impl<MyGame::Example::MonsterT,_std::default_delete<MyGame::Example::MonsterT>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_MyGame::Example::MonsterT_*,_std::default_delete<MyGame::Example::MonsterT>_>
                         .super__Head_base<0UL,_MyGame::Example::MonsterT_*,_false>._M_head_impl);
      }
      local_e0 = pMVar25;
      std::
      vector<std::unique_ptr<MyGame::Example::MonsterT,std::default_delete<MyGame::Example::MonsterT>>,std::allocator<std::unique_ptr<MyGame::Example::MonsterT,std::default_delete<MyGame::Example::MonsterT>>>>
      ::emplace_back<MyGame::Example::MonsterT*>(local_b0,&local_e0);
      puVar29 = puVar29 + 1;
    } while (puVar29 != puVar9);
  }
  std::
  vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ::reserve((vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
             *)local_b8,
            (long)(o->vector_of_referrables).
                  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(o->vector_of_referrables).
                  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar28 = (o->vector_of_referrables).
            super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar10 = (o->vector_of_referrables).
            super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar28 != puVar10) {
    do {
      if ((puVar28->_M_t).
          super___uniq_ptr_impl<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
          ._M_t.
          super__Tuple_impl<0UL,_MyGame::Example::ReferrableT_*,_std::default_delete<MyGame::Example::ReferrableT>_>
          .super__Head_base<0UL,_MyGame::Example::ReferrableT_*,_false>._M_head_impl ==
          (ReferrableT *)0x0) {
        local_e0 = (MonsterT *)0x0;
      }
      else {
        local_e0 = (MonsterT *)operator_new(8);
        (local_e0->pos)._M_t.
        super___uniq_ptr_impl<MyGame::Example::Vec3,_std::default_delete<MyGame::Example::Vec3>_>.
        _M_t.
        super__Tuple_impl<0UL,_MyGame::Example::Vec3_*,_std::default_delete<MyGame::Example::Vec3>_>
        .super__Head_base<0UL,_MyGame::Example::Vec3_*,_false>._M_head_impl =
             (Vec3 *)((puVar28->_M_t).
                      super___uniq_ptr_impl<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_MyGame::Example::ReferrableT_*,_std::default_delete<MyGame::Example::ReferrableT>_>
                      .super__Head_base<0UL,_MyGame::Example::ReferrableT_*,_false>._M_head_impl)->
                     id;
      }
      std::
      vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
      ::emplace_back<MyGame::Example::ReferrableT*>(local_b8,(ReferrableT **)&local_e0);
      puVar28 = puVar28 + 1;
    } while (puVar28 != puVar10);
  }
  std::
  vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ::reserve((vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
             *)local_c0,
            (long)(o->vector_of_strong_referrables).
                  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(o->vector_of_strong_referrables).
                  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar28 = (o->vector_of_strong_referrables).
            super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar10 = (o->vector_of_strong_referrables).
            super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar28 != puVar10) {
    do {
      if ((puVar28->_M_t).
          super___uniq_ptr_impl<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
          ._M_t.
          super__Tuple_impl<0UL,_MyGame::Example::ReferrableT_*,_std::default_delete<MyGame::Example::ReferrableT>_>
          .super__Head_base<0UL,_MyGame::Example::ReferrableT_*,_false>._M_head_impl ==
          (ReferrableT *)0x0) {
        local_e0 = (MonsterT *)0x0;
      }
      else {
        local_e0 = (MonsterT *)operator_new(8);
        (local_e0->pos)._M_t.
        super___uniq_ptr_impl<MyGame::Example::Vec3,_std::default_delete<MyGame::Example::Vec3>_>.
        _M_t.
        super__Tuple_impl<0UL,_MyGame::Example::Vec3_*,_std::default_delete<MyGame::Example::Vec3>_>
        .super__Head_base<0UL,_MyGame::Example::Vec3_*,_false>._M_head_impl =
             (Vec3 *)((puVar28->_M_t).
                      super___uniq_ptr_impl<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_MyGame::Example::ReferrableT_*,_std::default_delete<MyGame::Example::ReferrableT>_>
                      .super__Head_base<0UL,_MyGame::Example::ReferrableT_*,_false>._M_head_impl)->
                     id;
      }
      std::
      vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
      ::emplace_back<MyGame::Example::ReferrableT*>(local_c0,(ReferrableT **)&local_e0);
      puVar28 = puVar28 + 1;
    } while (puVar28 != puVar10);
  }
  std::
  vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
  ::reserve((vector<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
             *)local_c8,
            (long)(o->vector_of_co_owning_references).
                  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(o->vector_of_co_owning_references).
                  super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar28 = (o->vector_of_co_owning_references).
            super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar10 = (o->vector_of_co_owning_references).
            super__Vector_base<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>,_std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar28 != puVar10) {
    do {
      if ((puVar28->_M_t).
          super___uniq_ptr_impl<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
          ._M_t.
          super__Tuple_impl<0UL,_MyGame::Example::ReferrableT_*,_std::default_delete<MyGame::Example::ReferrableT>_>
          .super__Head_base<0UL,_MyGame::Example::ReferrableT_*,_false>._M_head_impl ==
          (ReferrableT *)0x0) {
        local_e0 = (MonsterT *)0x0;
      }
      else {
        local_e0 = (MonsterT *)operator_new(8);
        (local_e0->pos)._M_t.
        super___uniq_ptr_impl<MyGame::Example::Vec3,_std::default_delete<MyGame::Example::Vec3>_>.
        _M_t.
        super__Tuple_impl<0UL,_MyGame::Example::Vec3_*,_std::default_delete<MyGame::Example::Vec3>_>
        .super__Head_base<0UL,_MyGame::Example::Vec3_*,_false>._M_head_impl =
             (Vec3 *)((puVar28->_M_t).
                      super___uniq_ptr_impl<MyGame::Example::ReferrableT,_std::default_delete<MyGame::Example::ReferrableT>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_MyGame::Example::ReferrableT_*,_std::default_delete<MyGame::Example::ReferrableT>_>
                      .super__Head_base<0UL,_MyGame::Example::ReferrableT_*,_false>._M_head_impl)->
                     id;
      }
      std::
      vector<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>,std::allocator<std::unique_ptr<MyGame::Example::ReferrableT,std::default_delete<MyGame::Example::ReferrableT>>>>
      ::emplace_back<MyGame::Example::ReferrableT*>(local_c8,(ReferrableT **)&local_e0);
      puVar28 = puVar28 + 1;
    } while (puVar28 != puVar10);
  }
  std::
  vector<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
  ::reserve(&this->scalar_key_sorted_tables,
            (long)(o->scalar_key_sorted_tables).
                  super__Vector_base<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(o->scalar_key_sorted_tables).
                  super__Vector_base<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar30 = (o->scalar_key_sorted_tables).
            super__Vector_base<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar11 = (o->scalar_key_sorted_tables).
            super__Vector_base<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>,_std::allocator<std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar30 != puVar11) {
    do {
      if ((puVar30->_M_t).
          super___uniq_ptr_impl<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>
          ._M_t.
          super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>
          .super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl == (StatT *)0x0) {
        pMVar25 = (MonsterT *)0x0;
      }
      else {
        pMVar25 = (MonsterT *)operator_new(0x30);
        pSVar7 = (puVar30->_M_t).
                 super___uniq_ptr_impl<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>
                 .super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl;
        (pMVar25->pos)._M_t.
        super___uniq_ptr_impl<MyGame::Example::Vec3,_std::default_delete<MyGame::Example::Vec3>_>.
        _M_t.
        super__Tuple_impl<0UL,_MyGame::Example::Vec3_*,_std::default_delete<MyGame::Example::Vec3>_>
        .super__Head_base<0UL,_MyGame::Example::Vec3_*,_false>._M_head_impl = (Vec3 *)&pMVar25->name
        ;
        lVar8 = *(long *)&(pSVar7->id)._M_dataplus;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)pMVar25,lVar8,(pSVar7->id)._M_string_length + lVar8);
        *(uint16_t *)((long)&(pMVar25->name).field_2 + 8) = pSVar7->count;
        (pMVar25->name).field_2._M_allocated_capacity = pSVar7->val;
      }
      local_e0 = pMVar25;
      std::
      vector<std::unique_ptr<MyGame::Example::StatT,std::default_delete<MyGame::Example::StatT>>,std::allocator<std::unique_ptr<MyGame::Example::StatT,std::default_delete<MyGame::Example::StatT>>>>
      ::emplace_back<MyGame::Example::StatT*>
                ((vector<std::unique_ptr<MyGame::Example::StatT,std::default_delete<MyGame::Example::StatT>>,std::allocator<std::unique_ptr<MyGame::Example::StatT,std::default_delete<MyGame::Example::StatT>>>>
                  *)&this->scalar_key_sorted_tables,(StatT **)&local_e0);
      puVar30 = puVar30 + 1;
    } while (puVar30 != puVar11);
  }
  return;
}

Assistant:

inline MonsterT::MonsterT(const MonsterT &o)
      : pos((o.pos) ? new MyGame::Example::Vec3(*o.pos) : nullptr),
        mana(o.mana),
        hp(o.hp),
        name(o.name),
        inventory(o.inventory),
        color(o.color),
        test(o.test),
        test4(o.test4),
        testarrayofstring(o.testarrayofstring),
        enemy((o.enemy) ? new MyGame::Example::MonsterT(*o.enemy) : nullptr),
        testnestedflatbuffer(o.testnestedflatbuffer),
        testempty((o.testempty) ? new MyGame::Example::StatT(*o.testempty) : nullptr),
        testbool(o.testbool),
        testhashs32_fnv1(o.testhashs32_fnv1),
        testhashu32_fnv1(o.testhashu32_fnv1),
        testhashs64_fnv1(o.testhashs64_fnv1),
        testhashu64_fnv1(o.testhashu64_fnv1),
        testhashs32_fnv1a(o.testhashs32_fnv1a),
        testhashu32_fnv1a(o.testhashu32_fnv1a),
        testhashs64_fnv1a(o.testhashs64_fnv1a),
        testhashu64_fnv1a(o.testhashu64_fnv1a),
        testarrayofbools(o.testarrayofbools),
        testf(o.testf),
        testf2(o.testf2),
        testf3(o.testf3),
        testarrayofstring2(o.testarrayofstring2),
        testarrayofsortedstruct(o.testarrayofsortedstruct),
        flex(o.flex),
        test5(o.test5),
        vector_of_longs(o.vector_of_longs),
        vector_of_doubles(o.vector_of_doubles),
        parent_namespace_test((o.parent_namespace_test) ? new MyGame::InParentNamespaceT(*o.parent_namespace_test) : nullptr),
        single_weak_reference(o.single_weak_reference),
        vector_of_weak_references(o.vector_of_weak_references),
        co_owning_reference(o.co_owning_reference),
        non_owning_reference(o.non_owning_reference),
        vector_of_non_owning_references(o.vector_of_non_owning_references),
        any_unique(o.any_unique),
        any_ambiguous(o.any_ambiguous),
        vector_of_enums(o.vector_of_enums),
        signed_enum(o.signed_enum),
        testrequirednestedflatbuffer(o.testrequirednestedflatbuffer),
        native_inline(o.native_inline),
        long_enum_non_enum_default(o.long_enum_non_enum_default),
        long_enum_normal_default(o.long_enum_normal_default),
        nan_default(o.nan_default),
        inf_default(o.inf_default),
        positive_inf_default(o.positive_inf_default),
        infinity_default(o.infinity_default),
        positive_infinity_default(o.positive_infinity_default),
        negative_inf_default(o.negative_inf_default),
        negative_infinity_default(o.negative_infinity_default),
        double_inf_default(o.double_inf_default) {
  testarrayoftables.reserve(o.testarrayoftables.size());
  for (const auto &testarrayoftables_ : o.testarrayoftables) { testarrayoftables.emplace_back((testarrayoftables_) ? new MyGame::Example::MonsterT(*testarrayoftables_) : nullptr); }
  vector_of_referrables.reserve(o.vector_of_referrables.size());
  for (const auto &vector_of_referrables_ : o.vector_of_referrables) { vector_of_referrables.emplace_back((vector_of_referrables_) ? new MyGame::Example::ReferrableT(*vector_of_referrables_) : nullptr); }
  vector_of_strong_referrables.reserve(o.vector_of_strong_referrables.size());
  for (const auto &vector_of_strong_referrables_ : o.vector_of_strong_referrables) { vector_of_strong_referrables.emplace_back((vector_of_strong_referrables_) ? new MyGame::Example::ReferrableT(*vector_of_strong_referrables_) : nullptr); }
  vector_of_co_owning_references.reserve(o.vector_of_co_owning_references.size());
  for (const auto &vector_of_co_owning_references_ : o.vector_of_co_owning_references) { vector_of_co_owning_references.emplace_back((vector_of_co_owning_references_) ? new ReferrableT(*vector_of_co_owning_references_) : nullptr); }
  scalar_key_sorted_tables.reserve(o.scalar_key_sorted_tables.size());
  for (const auto &scalar_key_sorted_tables_ : o.scalar_key_sorted_tables) { scalar_key_sorted_tables.emplace_back((scalar_key_sorted_tables_) ? new MyGame::Example::StatT(*scalar_key_sorted_tables_) : nullptr); }
}